

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void parse_partname(string *part_name)

{
  bool bVar1;
  long lVar2;
  string frame;
  string local_40 [32];
  
  lVar2 = std::__cxx11::string::rfind((char *)part_name,0x10b055);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&frame,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&frame);
    std::__cxx11::string::~string((string *)&frame);
  }
  lVar2 = std::__cxx11::string::rfind((char *)part_name,0x10b057);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&frame,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&frame);
    std::__cxx11::string::~string((string *)&frame);
    lVar2 = std::__cxx11::string::rfind((char *)part_name,0x10b05c);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&frame,(ulong)part_name);
      bVar1 = is_number(&frame);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_40,(ulong)part_name);
        std::__cxx11::string::operator=((string *)part_name,local_40);
        std::__cxx11::string::~string(local_40);
      }
      std::__cxx11::string::~string((string *)&frame);
    }
  }
  return;
}

Assistant:

void
parse_partname (string& part_name)
{
    // strip off a path delimitation
    size_t posSlash = part_name.rfind (IMF_PATH_SEPARATOR);
    if (posSlash != string::npos) part_name = part_name.substr (posSlash + 1);

    // strip the exr ext
    size_t pos = part_name.rfind (".exr");
    if (pos != string::npos)
    {
        part_name = part_name.substr (0, pos);

        // strip off the frame number
        size_t pos2 = part_name.rfind (".");
        if (pos2 != string::npos)
        {
            string frame = part_name.substr (pos2 + 1, pos);
            if (is_number (frame)) part_name = part_name.substr (0, pos2);
        }
    }
}